

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  bool verbose;
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  invalid_argument *this;
  uint uVar5;
  long lVar6;
  double dVar7;
  float local_50;
  char *local_48;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    iVar1 = -1;
  }
  else {
    lVar6 = 100;
    local_50 = 0.0;
    uVar5 = 1;
    pcVar3 = (char *)0x0;
    verbose = false;
    local_48 = (char *)0x0;
    do {
      __s1 = argv[uVar5];
      iVar1 = strcmp(__s1,"-w");
      if (iVar1 == 0) {
        if (argc + -2 < (int)uVar5) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"Missing width for -w argument");
          goto LAB_00102925;
        }
        lVar6 = strtol(argv[(ulong)uVar5 + 1],(char **)0x0,0);
        iVar1 = 2;
        __s1 = local_48;
        if ((int)lVar6 < 1) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this,"preview width must be greater than zero");
          goto LAB_00102925;
        }
      }
      else {
        iVar1 = strcmp(__s1,"-e");
        if (iVar1 == 0) {
          if (argc + -2 < (int)uVar5) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"missing exposure for -e argument");
            goto LAB_00102925;
          }
          dVar7 = strtod(argv[(ulong)uVar5 + 1],(char **)0x0);
          local_50 = (float)dVar7;
          iVar1 = 2;
          __s1 = local_48;
        }
        else {
          iVar2 = strcmp(__s1,"-v");
          iVar1 = 1;
          if (iVar2 == 0) {
            verbose = true;
            __s1 = local_48;
          }
          else {
            iVar2 = strcmp(__s1,"-h");
            if ((iVar2 == 0) || (iVar2 = strcmp(__s1,"--help"), iVar2 == 0)) {
              usageMessage((ostream *)&std::cout,"exrmakepreview",true);
              goto LAB_001028ba;
            }
            iVar2 = strcmp(__s1,"--version");
            if (iVar2 == 0) {
              pcVar3 = (char *)Imf_3_4::getLibraryVersion();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"exrmakepreview (OpenEXR) ",0x19);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.4.0",5);
              iVar1 = strcmp(pcVar3,"3.4.0");
              if (iVar1 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"(OpenEXR version ",0x11);
                if (pcVar3 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107100);
                }
                else {
                  sVar4 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pcVar3,sVar4);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout," https://openexr.com",0x14);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
              std::ostream::put('\0');
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",
                         0x31);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
              std::ostream::put('\0');
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
              std::ostream::put('\0');
              std::ostream::flush();
              goto LAB_001028ba;
            }
            if (pcVar3 == (char *)0x0) {
              pcVar3 = __s1;
              __s1 = local_48;
            }
          }
        }
      }
      local_48 = __s1;
      uVar5 = uVar5 + iVar1;
    } while ((int)uVar5 < argc);
    if (local_48 == (char *)0x0 || pcVar3 == (char *)0x0) {
      iVar1 = -1;
      usageMessage((ostream *)&std::cerr,*argv,false);
    }
    else {
      iVar1 = strcmp(pcVar3,local_48);
      if (iVar1 == 0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Input and output cannot be the same file");
LAB_00102925:
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      makePreview(pcVar3,local_48,(int)lVar6,local_50,verbose);
LAB_001028ba:
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
main (int argc, char** argv)
{
    const char* inFile       = 0;
    const char* outFile      = 0;
    int         previewWidth = 100;
    float       exposure     = 0;
    bool        verbose      = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {
        int i = 1;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-w"))
            {
                //
                // Set preview image width
                //

                if (i > argc - 2)
                    throw invalid_argument ("Missing width for -w argument");

                previewWidth = strtol (argv[i + 1], 0, 0);
                if (previewWidth <= 0)
                    throw invalid_argument (
                        "preview width must be greater than zero");

                i += 2;
            }
            else if (!strcmp (argv[i], "-e"))
            {
                //
                // Set exposure
                //

                if (i > argc - 2)
                    throw invalid_argument ("missing exposure for -e argument");

                exposure = strtod (argv[i + 1], 0);

                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmakepreview", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmakepreview (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // Image file name
                //

                if (inFile == 0)
                    inFile = argv[i];
                else
                    outFile = argv[i];

                i += 1;
            }
        }

        if (inFile == 0 || outFile == 0)
        {
            usageMessage (cerr, argv[0], false);
            return -1;
        }

        if (!strcmp (inFile, outFile))
            throw invalid_argument ("Input and output cannot be the same file");

        if (previewWidth <= 0)
            throw invalid_argument (
                "Preview image width must be greater than zero");

        //
        // Load inFile, add a preview image, and save the result in outFile.
        //

        makePreview (inFile, outFile, previewWidth, exposure, verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}